

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_space.h
# Opt level: O2

void __thiscall
Small_Space<8U>::Check
          (Small_Space<8U> *this,HashMap<8U> *mp,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  int iVar9;
  ostream *poVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  __node_base *p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined8 in_XMM3_Qb;
  int local_38;
  int iStack_34;
  
  p_Var14 = &(mp->_M_h)._M_before_begin;
  auVar20 = ZEXT1664((undefined1  [16])0x0);
  iVar11 = 0;
  while( true ) {
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == (__node_base *)0x0) break;
    iVar9 = (*(this->super_Abstract<8U>)._vptr_Abstract[2])(this,p_Var14 + 1);
    local_38 = auVar20._0_4_;
    iStack_34 = auVar20._4_4_;
    iVar3 = (int)((_Prime_rehash_policy *)(p_Var14 + 2))->_M_max_load_factor;
    iVar4 = (this->super_Abstract<8U>).HIT;
    if ((iVar4 < iVar3) && (iStack_34 = iStack_34 + 1, iVar4 < iVar9)) {
      iVar11 = iVar11 + 1;
      iVar12 = iVar3 - iVar9;
      iVar13 = -iVar12;
      if (0 < iVar12) {
        iVar13 = iVar12;
      }
      auVar18._0_8_ = (double)iVar13;
      auVar18._8_8_ = in_XMM3_Qb;
      auVar16._0_8_ = auVar18._0_8_ / (double)iVar3;
      auVar16._8_8_ = in_XMM3_Qb;
      auVar15 = vunpcklpd_avx(auVar18,auVar16);
      (this->super_Abstract<8U>).aae = auVar15._0_8_ + (this->super_Abstract<8U>).aae;
      (this->super_Abstract<8U>).are = auVar15._8_8_ + (this->super_Abstract<8U>).are;
    }
    auVar15 = vpinsrd_avx(ZEXT416(local_38 + (uint)(iVar4 < iVar9)),iStack_34,1);
    auVar20 = ZEXT1664(auVar15);
  }
  auVar17._0_8_ = (double)iVar11;
  auVar15._0_8_ = (this->super_Abstract<8U>).aae;
  auVar15._8_8_ = (this->super_Abstract<8U>).are;
  auVar17._8_8_ = auVar17._0_8_;
  auVar15 = vdivpd_avx(auVar15,auVar17);
  (this->super_Abstract<8U>).aae = (double)auVar15._0_8_;
  (this->super_Abstract<8U>).are = (double)auVar15._8_8_;
  auVar8._8_4_ = 1;
  auVar8._0_8_ = 0x100000001;
  auVar8._12_4_ = 1;
  auVar15 = vpmaxsd_avx512vl(auVar20._0_16_,auVar8);
  auVar15 = vcvtdq2pd_avx(auVar15);
  auVar15 = vdivpd_avx(auVar17,auVar15);
  (this->super_Abstract<8U>).pr = (double)auVar15._0_8_;
  (this->super_Abstract<8U>).cr = (double)auVar15._8_8_;
  auVar15 = vshufpd_avx(auVar15,auVar15,1);
  poVar10 = std::ostream::_M_insert<double>(auVar15._0_8_);
  std::operator<<(poVar10,",");
  poVar10 = std::ostream::_M_insert<double>((this->super_Abstract<8U>).pr);
  std::operator<<(poVar10,",");
  dVar1 = (this->super_Abstract<8U>).pr;
  dVar2 = (this->super_Abstract<8U>).cr;
  dVar5 = dVar1 + dVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5;
  uVar6 = vcmpsd_avx512f(auVar19,ZEXT816(0x3e112e0be826d695),1);
  bVar7 = (bool)((byte)uVar6 & 1);
  poVar10 = std::ostream::_M_insert<double>
                      (((dVar1 + dVar1) * dVar2) /
                       (double)((ulong)bVar7 * 0x3ff0000000000000 + (ulong)!bVar7 * (long)dVar5));
  std::operator<<(poVar10,",");
  poVar10 = std::ostream::_M_insert<double>((this->super_Abstract<8U>).are);
  std::operator<<(poVar10,",");
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, const std::vector<std::ostream*>& outs) {
		int value = 0, all = 0, hit = 0, size = 0;
		for (typename HashMap<DATA_LEN>::iterator it = mp.begin(); it != mp.end(); ++it) {
			value = Query(it->first);
			if (it->second > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
					this->aae += abs(it->second - value);
					this->are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->aae /= hit;
		this->are /= hit;
		this->cr = hit / (double)std::max(1, all);
		this->pr = hit / (double)std::max(1, size);
		*outs[0] << this->cr << ",";
		*outs[1] << this->pr << ",";
		*outs[2] << 2 * this->pr * this->cr / ((this->pr + this->cr < 1e-9) ? 1.0 : this->pr + this->cr) << ",";
		*outs[3] << this->are << ",";
	}